

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O1

void free_effect(effect *source)

{
  effect *peVar1;
  effect *e;
  
  if (source != (effect *)0x0) {
    do {
      peVar1 = source->next;
      dice_free(source->dice);
      if (source->msg != (char *)0x0) {
        string_free(source->msg);
      }
      mem_free(source);
      source = peVar1;
    } while (peVar1 != (effect *)0x0);
  }
  return;
}

Assistant:

void free_effect(struct effect *source)
{
	struct effect *e = source, *e_next;
	while (e) {
		e_next = e->next;
		dice_free(e->dice);
		if (e->msg) {
			string_free(e->msg);
		}
		mem_free(e);
		e = e_next;
	}
}